

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

xxh_u8 * XXH3_consumeStripes(xxh_u64 *acc,size_t *nbStripesSoFarPtr,size_t nbStripesPerBlock,
                            xxh_u8 *input,size_t nbStripes,xxh_u8 *secret,size_t secretLimit,
                            XXH3_f_accumulate f_acc,XXH3_f_scrambleAcc f_scramble)

{
  xxh_u8 *secret_00;
  ulong nbStripes_00;
  size_t sVar1;
  
  sVar1 = *nbStripesSoFarPtr;
  secret_00 = secret + sVar1 * 8;
  if (nbStripesPerBlock - sVar1 <= nbStripes) {
    nbStripes_00 = nbStripesPerBlock - sVar1;
    do {
      XXH3_accumulate_sse2(acc,input,secret_00,nbStripes_00);
      XXH3_scrambleAcc_sse2(acc,secret + secretLimit);
      nbStripes = nbStripes - nbStripes_00;
      input = input + nbStripes_00 * 0x40;
      secret_00 = secret;
      nbStripes_00 = nbStripesPerBlock;
    } while (nbStripesPerBlock <= nbStripes);
    *nbStripesSoFarPtr = 0;
    sVar1 = 0;
  }
  if (nbStripes != 0) {
    XXH3_accumulate_sse2(acc,input,secret_00,nbStripes);
    input = input + nbStripes * 0x40;
    *nbStripesSoFarPtr = sVar1 + nbStripes;
  }
  return input;
}

Assistant:

XXH_FORCE_INLINE const xxh_u8 *
XXH3_consumeStripes(xxh_u64* XXH_RESTRICT acc,
                    size_t* XXH_RESTRICT nbStripesSoFarPtr, size_t nbStripesPerBlock,
                    const xxh_u8* XXH_RESTRICT input, size_t nbStripes,
                    const xxh_u8* XXH_RESTRICT secret, size_t secretLimit,
                    XXH3_f_accumulate f_acc,
                    XXH3_f_scrambleAcc f_scramble)
{
    const xxh_u8* initialSecret = secret + *nbStripesSoFarPtr * XXH_SECRET_CONSUME_RATE;
    /* Process full blocks */
    if (nbStripes >= (nbStripesPerBlock - *nbStripesSoFarPtr)) {
        /* Process the initial partial block... */
        size_t nbStripesThisIter = nbStripesPerBlock - *nbStripesSoFarPtr;

        do {
            /* Accumulate and scramble */
            f_acc(acc, input, initialSecret, nbStripesThisIter);
            f_scramble(acc, secret + secretLimit);
            input += nbStripesThisIter * XXH_STRIPE_LEN;
            nbStripes -= nbStripesThisIter;
            /* Then continue the loop with the full block size */
            nbStripesThisIter = nbStripesPerBlock;
            initialSecret = secret;
        } while (nbStripes >= nbStripesPerBlock);
        *nbStripesSoFarPtr = 0;
    }
    /* Process a partial block */
    if (nbStripes > 0) {
        f_acc(acc, input, initialSecret, nbStripes);
        input += nbStripes * XXH_STRIPE_LEN;
        *nbStripesSoFarPtr += nbStripes;
    }
    /* Return end pointer */
    return input;
}